

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O1

bool __thiscall DiskTableNode::mightIn(DiskTableNode *this,longlong key)

{
  bool bVar1;
  SSTableHeader *pSVar2;
  longlong local_18;
  
  local_18 = key;
  pSVar2 = SSTable::getHeader(this->_sstable);
  if (this->filter == (Filter *)0x0) {
    loadIndexFilter(this);
  }
  if ((local_18 < pSVar2->key_min) || (pSVar2->key_max < local_18)) {
    bVar1 = false;
  }
  else {
    bVar1 = BloomFilter<long_long>::find(this->filter,&local_18);
  }
  return bVar1;
}

Assistant:

bool DiskTableNode::mightIn(long long key) {
    auto *h = getHeader();
    auto *f = getFilter();
    return key >= h->key_min && key <= h->key_max && f->find(key);
}